

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Point3f __thiscall
pbrt::TransformMapping3D::Map
          (TransformMapping3D *this,TextureEvalContext ctx,Vector3f *dpdx,Vector3f *dpdy)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  Vector3<float> VVar4;
  Tuple3<pbrt::Point3,_float> TVar5;
  
  VVar4 = Transform::operator()(&this->textureFromRender,&ctx.dpdx);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vmovlps_avx(auVar2);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).z = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar4 = Transform::operator()(&this->textureFromRender,&ctx.dpdy);
  auVar3._8_8_ = extraout_XMM0_Qb_00;
  auVar3._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vmovlps_avx(auVar3);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).z = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  TVar5 = (Tuple3<pbrt::Point3,_float>)Transform::operator()(&this->textureFromRender,&ctx.p);
  return (Point3f)TVar5;
}

Assistant:

PBRT_CPU_GPU
    Point3f Map(TextureEvalContext ctx, Vector3f *dpdx, Vector3f *dpdy) const {
        *dpdx = textureFromRender(ctx.dpdx);
        *dpdy = textureFromRender(ctx.dpdy);
        return textureFromRender(ctx.p);
    }